

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O0

FX * get_nextFX(FX *fx)

{
  DLword DVar1;
  FX *fx_local;
  
  if (URaid_scanlink == 0) {
    fx_local = (FX *)NativeAligned4FromStackOffset((fx->alink & 0xfffe) - 10);
  }
  else {
    if (((undefined1  [20])*fx & (undefined1  [20])0x1) == (undefined1  [20])0x0) {
      DVar1 = fx->alink;
    }
    else {
      DVar1 = fx->clink;
    }
    fx_local = (FX *)NativeAligned4FromStackOffset(DVar1 - 10);
  }
  return fx_local;
}

Assistant:

FX *get_nextFX(FX *fx) {

  if (URaid_scanlink == URSCAN_ALINK)
    return ((FX *)NativeAligned4FromStackOffset(GETALINK(fx)));
  else
    return ((FX *)NativeAligned4FromStackOffset(GETCLINK(fx)));

}